

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

UfsType __thiscall
Clasp::DefaultUnfoundedCheck::findNonHcfUfs(DefaultUnfoundedCheck *this,Solver *s)

{
  pointer ppNVar1;
  size_type sVar2;
  uint32 uVar3;
  size_type sVar4;
  uint uVar5;
  ExtendedStats *pEVar6;
  pointer puVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  pointer ppNVar13;
  size_type local_3c;
  uint local_38;
  
  uVar11 = (ulong)(this->graph_->components_).ebo_.size;
  if (uVar11 != 0) {
    ppNVar13 = (this->graph_->components_).ebo_.buf;
    ppNVar1 = ppNVar13 + uVar11;
    ppNVar13 = ppNVar13 + *(uint *)(((this->mini_).ptr_ & 0xfffffffffffffffe) + 0x14);
    do {
      pEVar6 = (s->stats).extra;
      if (pEVar6 != (ExtendedStats *)0x0) {
        sVar2 = (s->assign_).trail.ebo_.size;
        uVar3 = (s->assign_).elims_;
        sVar4 = (s->assign_).assign_.ebo_.size;
        pEVar6->hccTests = pEVar6->hccTests + 1;
        pEVar6->hccPartial = (ulong)(sVar4 != sVar2 + uVar3 + 1) + pEVar6->hccPartial;
      }
      Asp::PrgDepGraph::NonHcfComponent::assumptionsFromAssignment(*ppNVar13,s,&this->loopAtoms_);
      bVar8 = Asp::PrgDepGraph::NonHcfComponent::test
                        (*ppNVar13,s,&this->loopAtoms_,&this->invalidQ_);
      if ((!bVar8) || ((s->conflict_).ebo_.size != 0)) {
        uVar11 = (ulong)(this->invalidQ_).ebo_.size;
        if (uVar11 == 0) {
          local_3c = 0;
        }
        else {
          puVar7 = (this->invalidQ_).ebo_.buf;
          lVar12 = 0;
          local_38 = 0xffffffff;
          local_3c = 0;
          do {
            uVar10 = *(uint *)((long)puVar7 + lVar12);
            uVar5 = (this->graph_->atoms_).ebo_.buf[uVar10].super_Node.lit.rep_;
            uVar9 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar5 & 0xfffffffc));
            if (((byte)((byte)uVar9 & 3) == (byte)(2U - ((uVar5 & 2) == 0))) &&
               (uVar9 = uVar9 >> 4, uVar9 < local_38)) {
              local_3c = (this->ufs_).vec.ebo_.size;
              local_38 = uVar9;
            }
            pushUfs(this,uVar10);
            lVar12 = lVar12 + 4;
          } while (uVar11 << 2 != lVar12);
        }
        if (local_3c != 0) {
          puVar7 = (this->ufs_).vec.ebo_.buf;
          uVar10 = *puVar7;
          *puVar7 = puVar7[local_3c];
          puVar7[local_3c] = uVar10;
        }
        (this->invalidQ_).ebo_.size = 0;
        (this->loopAtoms_).ebo_.size = 0;
        *(int *)(((this->mini_).ptr_ & 0xfffffffffffffffe) + 0x14) =
             (int)((ulong)((long)ppNVar13 - (long)(this->graph_->components_).ebo_.buf) >> 3);
        return ufs_non_poly;
      }
      ppNVar13 = ppNVar13 + 1;
      if (ppNVar13 == ppNVar1) {
        ppNVar13 = (this->graph_->components_).ebo_.buf;
      }
      (this->loopAtoms_).ebo_.size = 0;
      uVar10 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 0);
  }
  MinimalityCheck::schedNext
            ((MinimalityCheck *)((this->mini_).ptr_ & 0xfffffffffffffffe),
             (s->levels_).super_type.ebo_.size,true);
  return ufs_none;
}

Assistant:

DefaultUnfoundedCheck::UfsType DefaultUnfoundedCheck::findNonHcfUfs(Solver& s) {
	assert(invalidQ_.empty() && loopAtoms_.empty());
	typedef DependencyGraph::NonHcfIter HccIter;
	HccIter hIt  = graph_->nonHcfBegin() + mini_->scc;
	HccIter hEnd = graph_->nonHcfEnd();
	for (uint32 checks = graph_->numNonHcfs(); checks--;) {
		s.stats.addTest(s.numFreeVars() != 0);
		(*hIt)->assumptionsFromAssignment(s, loopAtoms_);
		if (!(*hIt)->test(s, loopAtoms_, invalidQ_) || s.hasConflict()) {
			uint32 pos = 0, minDL = UINT32_MAX;
			for (VarVec::const_iterator it = invalidQ_.begin(), end = invalidQ_.end(); it != end; ++it) {
				if (s.isTrue(graph_->getAtom(*it).lit) && s.level(graph_->getAtom(*it).lit.var()) < minDL) {
					minDL = s.level(graph_->getAtom(*it).lit.var());
					pos   = (uint32)ufs_.vec.size();
				}
				pushUfs(*it);
			}
			if (pos) {
				std::swap(ufs_.vec.front(), ufs_.vec[pos]);
			}
			invalidQ_.clear();
			loopAtoms_.clear();
			mini_->scc = static_cast<uint32>(hIt - graph_->nonHcfBegin());
			return ufs_non_poly;
		}
		if (++hIt == hEnd) { hIt = graph_->nonHcfBegin(); }
		loopAtoms_.clear();
	}
	mini_->schedNext(s.decisionLevel(), true);
	return ufs_none;
}